

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

void FT_Request_Metrics(FT_Face face,FT_Size_Request req)

{
  FT_Size_Metrics *metrics;
  FT_Size_Request_Type FVar1;
  FT_Size pFVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong b_;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  
  pFVar2 = face->size;
  metrics = &pFVar2->metrics;
  if ((face->face_flags & 1) == 0) {
    (pFVar2->metrics).descender = 0;
    (pFVar2->metrics).height = 0;
    (pFVar2->metrics).y_scale = 0;
    (pFVar2->metrics).ascender = 0;
    metrics->x_ppem = 0;
    metrics->y_ppem = 0;
    *(undefined4 *)&metrics->field_0x4 = 0;
    (pFVar2->metrics).x_scale = 0;
    (pFVar2->metrics).max_advance = 0;
    (pFVar2->metrics).x_scale = 0x10000;
    (pFVar2->metrics).y_scale = 0x10000;
    return;
  }
  FVar1 = req->type;
  switch(FVar1) {
  case FT_SIZE_REQUEST_TYPE_NOMINAL:
    uVar5 = (ulong)face->units_per_EM;
    uVar3 = uVar5;
    break;
  case FT_SIZE_REQUEST_TYPE_REAL_DIM:
    uVar5 = (long)face->ascender - (long)face->descender;
    uVar3 = uVar5;
    break;
  case FT_SIZE_REQUEST_TYPE_BBOX:
    uVar5 = (face->bbox).yMax - (face->bbox).yMin;
    uVar3 = (face->bbox).xMax - (face->bbox).xMin;
    break;
  case FT_SIZE_REQUEST_TYPE_CELL:
    uVar5 = (long)face->ascender - (long)face->descender;
    uVar3 = (long)face->max_advance_width;
    break;
  case FT_SIZE_REQUEST_TYPE_SCALES:
    lVar11 = req->width;
    (pFVar2->metrics).x_scale = lVar11;
    lVar10 = req->height;
    (pFVar2->metrics).y_scale = lVar10;
    if (lVar11 == 0) {
      (pFVar2->metrics).x_scale = lVar10;
    }
    else if (lVar10 == 0) {
      (pFVar2->metrics).y_scale = lVar11;
    }
    lVar11 = 0;
    lVar10 = 0;
    goto LAB_001ed825;
  default:
    uVar5 = 0;
    uVar3 = 0;
  }
  b_ = -uVar3;
  if (0 < (long)uVar3) {
    b_ = uVar3;
  }
  uVar4 = -uVar5;
  if (0 < (long)uVar5) {
    uVar4 = uVar5;
  }
  lVar11 = req->width;
  if ((ulong)req->horiResolution != 0) {
    lVar10 = lVar11 * (ulong)req->horiResolution + 0x24;
    lVar11 = lVar10 >> 0x3f;
    lVar11 = (lVar10 / 0x12 + lVar11 >> 2) - lVar11;
  }
  lVar10 = req->height;
  if ((ulong)req->vertResolution != 0) {
    lVar8 = lVar10 * (ulong)req->vertResolution + 0x24;
    lVar10 = lVar8 >> 0x3f;
    lVar10 = (lVar8 / 0x12 + lVar10 >> 2) - lVar10;
  }
  if (req->width == 0) {
    if (uVar5 == 0) {
      uVar3 = 0x7fffffff;
    }
    else {
      lVar11 = -lVar10;
      if (0 < lVar10) {
        lVar11 = lVar10;
      }
      uVar3 = ((uVar4 >> 1) + lVar11 * 0x10000) / uVar4;
    }
    uVar5 = -uVar3;
    if (-1 < lVar10) {
      uVar5 = uVar3;
    }
    (pFVar2->metrics).y_scale = uVar5;
    (pFVar2->metrics).x_scale = uVar5;
    lVar11 = FT_MulDiv(lVar10,b_,uVar4);
  }
  else {
    if (uVar3 == 0) {
      uVar3 = 0x7fffffff;
    }
    else {
      lVar8 = -lVar11;
      if (0 < lVar11) {
        lVar8 = lVar11;
      }
      uVar3 = ((b_ >> 1) + lVar8 * 0x10000) / b_;
    }
    uVar6 = -uVar3;
    if (-1 < lVar11) {
      uVar6 = uVar3;
    }
    (pFVar2->metrics).x_scale = uVar6;
    if (req->height == 0) {
      (pFVar2->metrics).y_scale = uVar6;
      lVar10 = FT_MulDiv(lVar11,uVar4,b_);
    }
    else {
      if (uVar5 == 0) {
        uVar4 = 0x7fffffff;
      }
      else {
        lVar8 = -lVar10;
        if (0 < lVar10) {
          lVar8 = lVar10;
        }
        uVar4 = ((uVar4 >> 1) + lVar8 * 0x10000) / uVar4;
      }
      uVar3 = -uVar4;
      if (-1 < lVar10) {
        uVar3 = uVar4;
      }
      (pFVar2->metrics).y_scale = uVar3;
      if (FVar1 == FT_SIZE_REQUEST_TYPE_CELL) {
        if ((long)uVar6 < (long)uVar3) {
          (pFVar2->metrics).y_scale = uVar6;
        }
        else {
          (pFVar2->metrics).x_scale = uVar3;
        }
      }
    }
  }
LAB_001ed825:
  iVar7 = (int)lVar10;
  iVar9 = (int)lVar11;
  if (FVar1 != FT_SIZE_REQUEST_TYPE_NOMINAL) {
    lVar11 = (long)(int)(pFVar2->metrics).x_scale * (ulong)face->units_per_EM;
    iVar9 = (int)((ulong)(lVar11 + 0x8000 + (lVar11 >> 0x3f)) >> 0x10);
    lVar11 = (long)(int)(pFVar2->metrics).y_scale * (ulong)face->units_per_EM;
    iVar7 = (int)((ulong)(lVar11 + 0x8000 + (lVar11 >> 0x3f)) >> 0x10);
  }
  (pFVar2->metrics).x_ppem = (FT_UShort)(iVar9 + 0x20U >> 6);
  (pFVar2->metrics).y_ppem = (FT_UShort)(iVar7 + 0x20U >> 6);
  ft_recompute_scaled_metrics(face,metrics);
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Request_Metrics( FT_Face          face,
                      FT_Size_Request  req )
  {
    FT_Size_Metrics*  metrics;


    metrics = &face->size->metrics;

    if ( FT_IS_SCALABLE( face ) )
    {
      FT_Long  w = 0, h = 0, scaled_w = 0, scaled_h = 0;


      switch ( req->type )
      {
      case FT_SIZE_REQUEST_TYPE_NOMINAL:
        w = h = face->units_per_EM;
        break;

      case FT_SIZE_REQUEST_TYPE_REAL_DIM:
        w = h = face->ascender - face->descender;
        break;

      case FT_SIZE_REQUEST_TYPE_BBOX:
        w = face->bbox.xMax - face->bbox.xMin;
        h = face->bbox.yMax - face->bbox.yMin;
        break;

      case FT_SIZE_REQUEST_TYPE_CELL:
        w = face->max_advance_width;
        h = face->ascender - face->descender;
        break;

      case FT_SIZE_REQUEST_TYPE_SCALES:
        metrics->x_scale = (FT_Fixed)req->width;
        metrics->y_scale = (FT_Fixed)req->height;
        if ( !metrics->x_scale )
          metrics->x_scale = metrics->y_scale;
        else if ( !metrics->y_scale )
          metrics->y_scale = metrics->x_scale;
        goto Calculate_Ppem;

      case FT_SIZE_REQUEST_TYPE_MAX:
        break;
      }

      /* to be on the safe side */
      if ( w < 0 )
        w = -w;

      if ( h < 0 )
        h = -h;

      scaled_w = FT_REQUEST_WIDTH ( req );
      scaled_h = FT_REQUEST_HEIGHT( req );

      /* determine scales */
      if ( req->width )
      {
        metrics->x_scale = FT_DivFix( scaled_w, w );

        if ( req->height )
        {
          metrics->y_scale = FT_DivFix( scaled_h, h );

          if ( req->type == FT_SIZE_REQUEST_TYPE_CELL )
          {
            if ( metrics->y_scale > metrics->x_scale )
              metrics->y_scale = metrics->x_scale;
            else
              metrics->x_scale = metrics->y_scale;
          }
        }
        else
        {
          metrics->y_scale = metrics->x_scale;
          scaled_h = FT_MulDiv( scaled_w, h, w );
        }
      }
      else
      {
        metrics->x_scale = metrics->y_scale = FT_DivFix( scaled_h, h );
        scaled_w = FT_MulDiv( scaled_h, w, h );
      }

  Calculate_Ppem:
      /* calculate the ppems */
      if ( req->type != FT_SIZE_REQUEST_TYPE_NOMINAL )
      {
        scaled_w = FT_MulFix( face->units_per_EM, metrics->x_scale );
        scaled_h = FT_MulFix( face->units_per_EM, metrics->y_scale );
      }

      metrics->x_ppem = (FT_UShort)( ( scaled_w + 32 ) >> 6 );
      metrics->y_ppem = (FT_UShort)( ( scaled_h + 32 ) >> 6 );

      ft_recompute_scaled_metrics( face, metrics );
    }
    else
    {
      FT_ZERO( metrics );
      metrics->x_scale = 1L << 16;
      metrics->y_scale = 1L << 16;
    }
  }